

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O3

bool cmPolicies::ApplyPolicyVersion
               (cmMakefile *mf,uint majorVer,uint minorVer,uint patchVer,WarnCompat warnCompat)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *__s;
  string *psVar4;
  ostream *poVar5;
  cmState *this;
  cmValue cVar6;
  cmListFileContext *pcVar7;
  PolicyStatus status;
  uint uVar8;
  PolicyID id;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  string defaultVar;
  ostringstream e;
  allocator<char> local_211;
  cmMakefile *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (warnCompat == On) {
    if (1 < majorVer) {
      if (majorVer == 2 && minorVer < 8) {
        if (minorVer == 6 && patchVer == 0) {
          cmMakefile::GetStateSnapshot(mf);
          bVar10 = cmStateSnapshot::CanPopPolicyScope((cmStateSnapshot *)local_1a8);
          if (bVar10) {
            cmMakefile::GetBacktrace(mf);
            pcVar7 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                               ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_208);
            iVar3 = cmsys::SystemTools::Strucmp((pcVar7->Name)._M_dataplus._M_p,"cmake_policy");
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._M_string_length)
              ;
            }
            if (iVar3 == 0) goto LAB_002b5381;
          }
        }
      }
      else if (((majorVer != 2) || (minorVer != 8)) || (0xb < patchVer)) goto LAB_002b5381;
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "Compatibility with CMake < 2.8.12 will be removed from a future version of CMake.\nUpdate the VERSION argument <min> value or use a ...<max> suffix to tell CMake that the project does not need compatibility with older versions."
               ,"");
    cmMakefile::IssueMessage(mf,DEPRECATION_WARNING,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
LAB_002b5381:
  bVar10 = 2 < majorVer;
  bVar14 = majorVer == 3;
  uVar9 = minorVer + 1;
  uVar8 = patchVer + 1;
  bVar15 = patchVer == 0xffffffff;
  bVar11 = uVar9 < 9;
  bVar16 = minorVer == 8;
  bVar12 = 1 < majorVer;
  bVar17 = majorVer != 2;
  bVar13 = 6 < uVar9;
  bVar18 = minorVer != 6;
  id = CMP0000;
  local_210 = mf;
  do {
    switch(id) {
    case CMP0000:
    case CMP0001:
    case CMP0002:
    case CMP0003:
    case CMP0004:
    case CMP0005:
    case CMP0006:
    case CMP0007:
      if (((bVar18 || !bVar15) && bVar13 || bVar17) && bVar12) break;
      goto LAB_002b5939;
    case CMP0008:
      if ((uVar8 < 2 && !bVar18 || !bVar13) && !bVar17 || !bVar12) goto LAB_002b5939;
      break;
    case CMP0009:
      if ((uVar8 < 3 && !bVar18 || !bVar13) && !bVar17 || !bVar12) goto LAB_002b5939;
      break;
    case CMP0010:
    case CMP0011:
      if ((uVar8 < 4 && !bVar18 || !bVar13) && !bVar17 || !bVar12) goto LAB_002b5939;
      break;
    case CMP0012:
    case CMP0013:
    case CMP0014:
      if ((bVar16 && bVar15 || bVar11) && !bVar17 || !bVar12) goto LAB_002b5939;
      break;
    case CMP0015:
      if ((bVar16 && uVar8 < 2 || bVar11) && !bVar17 || !bVar12) goto LAB_002b5939;
      break;
    case CMP0016:
      if ((bVar16 && uVar8 < 4 || bVar11) && !bVar17 || !bVar12) goto LAB_002b5939;
      break;
    case CMP0017:
      if ((uVar8 < 5 && bVar16 || bVar11) && !bVar17 || !bVar12) goto LAB_002b5939;
      break;
    case CMP0018:
      if ((uVar8 < 10 && bVar16 || bVar11) && !bVar17 || !bVar12) goto LAB_002b5939;
      break;
    case CMP0019:
    case CMP0020:
      if ((uVar8 < 0xc && bVar16 || bVar11) && !bVar17 || !bVar12) goto LAB_002b5939;
      break;
    case CMP0021:
    case CMP0022:
    case CMP0023:
      if ((uVar8 < 0xd && bVar16 || bVar11) && !bVar17 || !bVar12) goto LAB_002b5939;
      break;
    case CMP0024:
    case CMP0025:
    case CMP0026:
    case CMP0027:
    case CMP0028:
    case CMP0029:
    case CMP0030:
    case CMP0031:
    case CMP0032:
    case CMP0033:
    case CMP0034:
    case CMP0035:
    case CMP0036:
    case CMP0037:
    case CMP0038:
    case CMP0039:
    case CMP0040:
    case CMP0041:
    case CMP0042:
    case CMP0043:
    case CMP0044:
    case CMP0045:
    case CMP0046:
    case CMP0047:
    case CMP0048:
    case CMP0049:
    case CMP0050:
      bVar1 = minorVer == 0 && bVar15 || minorVer == 0xffffffff;
      goto joined_r0x002b5bfa;
    case CMP0051:
    case CMP0052:
    case CMP0053:
    case CMP0054:
      if ((minorVer == 1 && bVar15 || uVar9 < 2) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0055:
    case CMP0056:
      if ((minorVer == 2 && bVar15 || uVar9 < 3) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0057:
    case CMP0058:
    case CMP0059:
    case CMP0060:
    case CMP0061:
    case CMP0062:
    case CMP0063:
      if ((minorVer == 3 && bVar15 || uVar9 < 4) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0064:
    case CMP0065:
      if ((minorVer == 4 && bVar15 || uVar9 < 5) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0066:
      if ((minorVer == 7 && bVar15 || uVar9 < 8) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0067:
      if (bVar14 && (bVar16 && bVar15 || bVar11) || !bVar10) goto LAB_002b5939;
      break;
    case CMP0068:
    case CMP0069:
      if ((minorVer == 9 && bVar15 || uVar9 < 10) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0070:
    case CMP0071:
      if ((minorVer == 10 && bVar15 || uVar9 < 0xb) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0072:
      if ((minorVer == 0xb && bVar15 || uVar9 < 0xc) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0073:
    case CMP0074:
    case CMP0075:
      if ((minorVer == 0xc && bVar15 || uVar9 < 0xd) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0076:
    case CMP0077:
    case CMP0078:
    case CMP0079:
    case CMP0080:
    case CMP0081:
      if ((minorVer == 0xd && bVar15 || uVar9 < 0xe) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0082:
    case CMP0083:
    case CMP0084:
    case CMP0085:
    case CMP0086:
    case CMP0087:
    case CMP0088:
      if ((minorVer == 0xe && bVar15 || uVar9 < 0xf) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0089:
    case CMP0090:
    case CMP0091:
    case CMP0092:
    case CMP0093:
    case CMP0094:
      if ((minorVer == 0xf && bVar15 || uVar9 < 0x10) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0095:
    case CMP0096:
    case CMP0097:
      if ((minorVer == 0x10 && bVar15 || uVar9 < 0x11) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0098:
    case CMP0099:
    case CMP0100:
    case CMP0101:
    case CMP0102:
      if ((minorVer == 0x11 && bVar15 || uVar9 < 0x12) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0103:
    case CMP0104:
    case CMP0105:
    case CMP0106:
    case CMP0107:
    case CMP0108:
      if ((minorVer == 0x12 && bVar15 || uVar9 < 0x13) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0109:
    case CMP0110:
    case CMP0111:
    case CMP0112:
    case CMP0113:
    case CMP0114:
      if ((minorVer == 0x13 && bVar15 || uVar9 < 0x14) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0115:
    case CMP0116:
    case CMP0117:
    case CMP0118:
    case CMP0119:
    case CMP0120:
      if ((minorVer == 0x14 && bVar15 || uVar9 < 0x15) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0121:
    case CMP0122:
    case CMP0123:
    case CMP0124:
    case CMP0125:
    case CMP0126:
      if ((minorVer == 0x15 && bVar15 || uVar9 < 0x16) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0127:
    case CMP0128:
      if ((minorVer == 0x16 && bVar15 || uVar9 < 0x17) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0129:
      if ((minorVer == 0x17 && bVar15 || uVar9 < 0x18) && bVar14 || !bVar10) goto LAB_002b5939;
      break;
    case CMP0130:
    case CMP0131:
    case CMP0132:
    case CMP0133:
    case CMP0134:
    case CMP0135:
    case CMP0136:
    case CMP0137:
    case CMP0138:
    case CMP0139:
      bVar1 = minorVer == 0x18 && bVar15 || uVar9 < 0x19;
joined_r0x002b5bfa:
      if ((!bVar1 || !bVar14) && bVar10) break;
LAB_002b5939:
      __s = idToString(id);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1e8._M_local_buf,__s,&local_211);
      std::operator+(&local_208,"CMAKE_POLICY_DEFAULT_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8
                    );
      psVar4 = cmMakefile::GetSafeDefinition(local_210,&local_208);
      iVar3 = std::__cxx11::string::compare((char *)psVar4);
      bVar1 = true;
      if (iVar3 == 0) {
        status = NEW;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)psVar4);
        if (iVar2 == 0) {
          status = OLD;
        }
        else {
          status = WARN;
          if (psVar4->_M_string_length != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                                local_208._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," has value \"",0xc);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\" but must be \"OLD\", \"NEW\", or \"\" (empty).",0x2a);
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(local_210,FATAL_ERROR,(string *)&local_1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_allocated_capacity != &local_1b8) {
              operator_delete((void *)local_1c8._M_allocated_capacity,
                              local_1b8._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            bVar1 = false;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (!bVar1) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_allocated_capacity == &local_1d8) {
          return false;
        }
        operator_delete((void *)local_1e8._M_allocated_capacity,local_1d8._M_allocated_capacity + 1)
        ;
        return false;
      }
      bVar1 = cmMakefile::SetPolicy(local_210,id,status);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_allocated_capacity != &local_1d8) {
        operator_delete((void *)local_1e8._M_allocated_capacity,local_1d8._M_allocated_capacity + 1)
        ;
      }
      if (!bVar1) {
        return false;
      }
      if (id == CMP0001 && iVar3 != 0) {
        this = cmMakefile::GetState(local_210);
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CMAKE_BACKWARDS_COMPATIBILITY","");
        cVar6 = cmState::GetInitializedCacheValue(this,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (cVar6.Value == (string *)0x0) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"CMAKE_BACKWARDS_COMPATIBILITY","");
          cmMakefile::AddCacheDefinition
                    (local_210,(string *)local_1a8,"2.4",
                     "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                     ,STRING,false);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
        }
      }
      goto LAB_002b5c19;
    case CMP0140:
    case CMP0141:
    case CMP0142:
      if ((minorVer == 0x19 && bVar15 || uVar9 < 0x1a) && bVar14 || !bVar10) goto LAB_002b5939;
    }
    bVar1 = cmMakefile::SetPolicy(local_210,id,NEW);
    if (!bVar1) {
      return false;
    }
LAB_002b5c19:
    id = id + CMP0001;
    if (id == CMPCOUNT) {
      return true;
    }
  } while( true );
}

Assistant:

bool cmPolicies::ApplyPolicyVersion(cmMakefile* mf, unsigned int majorVer,
                                    unsigned int minorVer,
                                    unsigned int patchVer,
                                    WarnCompat warnCompat)
{
  // Warn about policy versions for which support will be removed.
  if (warnCompat == WarnCompat::On &&
      (majorVer < 2 || (majorVer == 2 && minorVer < 8) ||
       (majorVer == 2 && minorVer == 8 && patchVer < 12)) &&
      // Avoid warning on calls generated by install(EXPORT)
      // in CMake versions prior to 3.18.
      !(majorVer == 2 && minorVer == 6 && patchVer == 0 &&
        mf->GetStateSnapshot().CanPopPolicyScope() &&
        cmSystemTools::Strucmp(mf->GetBacktrace().Top().Name.c_str(),
                               "cmake_policy") == 0)) {
    mf->IssueMessage(
      MessageType::DEPRECATION_WARNING,
      "Compatibility with CMake < 2.8.12 will be removed from "
      "a future version of CMake.\n"
      "Update the VERSION argument <min> value or use a ...<max> suffix "
      "to tell CMake that the project does not need compatibility with "
      "older versions.");
  }

  // now loop over all the policies and set them as appropriate
  std::vector<cmPolicies::PolicyID> ancientPolicies;
  for (PolicyID pid = cmPolicies::CMP0000; pid != cmPolicies::CMPCOUNT;
       pid = static_cast<PolicyID>(pid + 1)) {
    if (isPolicyNewerThan(pid, majorVer, minorVer, patchVer)) {
      if (cmPolicies::GetPolicyStatus(pid) == cmPolicies::REQUIRED_ALWAYS) {
        ancientPolicies.push_back(pid);
      } else {
        cmPolicies::PolicyStatus status = cmPolicies::WARN;
        if (!GetPolicyDefault(mf, idToString(pid), &status) ||
            !mf->SetPolicy(pid, status)) {
          return false;
        }
        if (pid == cmPolicies::CMP0001 &&
            (status == cmPolicies::WARN || status == cmPolicies::OLD)) {
          if (!(mf->GetState()->GetInitializedCacheValue(
                "CMAKE_BACKWARDS_COMPATIBILITY"))) {
            // Set it to 2.4 because that is the last version where the
            // variable had meaning.
            mf->AddCacheDefinition(
              "CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
              "For backwards compatibility, what version of CMake "
              "commands and "
              "syntax should this version of CMake try to support.",
              cmStateEnums::STRING);
          }
        }
      }
    } else {
      if (!mf->SetPolicy(pid, cmPolicies::NEW)) {
        return false;
      }
    }
  }

  // Make sure the project does not use any ancient policies.
  if (!ancientPolicies.empty()) {
    DiagnoseAncientPolicies(ancientPolicies, majorVer, minorVer, patchVer, mf);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}